

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest5::NegativeTest5(NegativeTest5 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"subroutine_uniform_wo_matching_subroutines",
             "Verifies that a link- or compile-time error occurs when trying to link a program with no subroutine for subroutine uniform variable."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020e3d90;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_has_test_passed = true;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

NegativeTest5::NegativeTest5(deqp::Context& context)
	: TestCase(context, "subroutine_uniform_wo_matching_subroutines",
			   "Verifies that a link- or compile-time error occurs when "
			   "trying to link a program with no subroutine for subroutine "
			   "uniform variable.")
	, m_fs_id(0)
	, m_gs_id(0)
	, m_has_test_passed(true)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}